

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlDOMWrapNSNormAddNsMapItem2
              (xmlNsPtr **list,int *size,int *number,xmlNsPtr oldNs,xmlNsPtr newNs)

{
  int iVar1;
  xmlNsPtr *ppxVar2;
  int newSize;
  xmlNsPtr *tmp;
  xmlNsPtr newNs_local;
  xmlNsPtr oldNs_local;
  int *number_local;
  int *size_local;
  xmlNsPtr **list_local;
  
  if (*size <= *number) {
    iVar1 = xmlGrowCapacity(*size,0x10,3,1000000000);
    if (iVar1 < 0) {
      return -1;
    }
    ppxVar2 = (xmlNsPtr *)(*xmlRealloc)(*list,(long)(iVar1 << 1) << 3);
    if (ppxVar2 == (xmlNsPtr *)0x0) {
      return -1;
    }
    *list = ppxVar2;
    *size = iVar1;
  }
  (*list)[*number << 1] = oldNs;
  (*list)[*number * 2 + 1] = newNs;
  *number = *number + 1;
  return 0;
}

Assistant:

static int
xmlDOMWrapNSNormAddNsMapItem2(xmlNsPtr **list, int *size, int *number,
			xmlNsPtr oldNs, xmlNsPtr newNs)
{
    if (*number >= *size) {
        xmlNsPtr *tmp;
        int newSize;

        newSize = xmlGrowCapacity(*size, 2 * sizeof(tmp[0]), 3, XML_MAX_ITEMS);
        if (newSize < 0)
            return(-1);
        tmp = xmlRealloc(*list, newSize * 2 * sizeof(tmp[0]));
        if (tmp == NULL)
            return(-1);
        *list = tmp;
        *size = newSize;
    }

    (*list)[2 * (*number)] = oldNs;
    (*list)[2 * (*number) +1] = newNs;
    (*number)++;
    return (0);
}